

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiTabItem * ImGui::TabBarTabListPopupButton(ImGuiTabBar *tab_bar)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImGuiTabItem *pIVar3;
  bool bVar4;
  ImGuiTabItem *tab_00;
  ImGuiTabBar *in_RDI;
  char *tab_name;
  ImGuiTabItem *tab;
  int tab_n;
  ImGuiTabItem *tab_to_select;
  bool open;
  ImVec4 arrow_col;
  ImGuiSelectableFlags in_stack_00000060;
  ImVec2 backup_cursor_pos;
  float tab_list_popup_button_width;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiComboFlags in_stack_000000cc;
  char *in_stack_000000d0;
  char *in_stack_000000d8;
  undefined8 in_stack_ffffffffffffff80;
  ImVec2 local_78;
  char *local_70;
  ImVec4 *in_stack_ffffffffffffff98;
  ImGuiCol in_stack_ffffffffffffffa4;
  int iVar5;
  ImGuiTabItem *local_58;
  ImVec4 local_4c;
  undefined8 local_3c;
  undefined4 local_34;
  float fStack_30;
  ImVec2 local_2c;
  ImVec2 local_24;
  float local_1c;
  ImGuiWindow *local_18;
  ImGuiContext *local_10;
  ImGuiTabBar *local_8;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_10 = GImGui;
  local_18 = GImGui->CurrentWindow;
  local_1c = GImGui->FontSize + (GImGui->Style).FramePadding.y;
  local_24 = (local_18->DC).CursorPos;
  local_8 = in_RDI;
  ImVec2::ImVec2(&local_2c,(in_RDI->BarRect).Min.x - (GImGui->Style).FramePadding.y,
                 (in_RDI->BarRect).Min.y);
  (local_18->DC).CursorPos = local_2c;
  (local_8->BarRect).Min.x = local_1c + (local_8->BarRect).Min.x;
  local_3c._0_4_ = (local_10->Style).Colors[0].x;
  local_3c._4_4_ = (local_10->Style).Colors[0].y;
  uVar1 = (local_10->Style).Colors[0].z;
  uVar2 = (local_10->Style).Colors[0].w;
  _local_34 = CONCAT44((float)uVar2 * 0.5,uVar1);
  PushStyleColor(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  ImVec4::ImVec4(&local_4c,0.0,0.0,0.0,0.0);
  PushStyleColor(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  bVar4 = BeginCombo(in_stack_000000d8,in_stack_000000d0,in_stack_000000cc);
  PopStyleColor(iVar5);
  local_58 = (ImGuiTabItem *)0x0;
  if (bVar4) {
    for (iVar5 = 0; iVar5 < (local_8->Tabs).Size; iVar5 = iVar5 + 1) {
      tab_00 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,iVar5);
      pIVar3 = local_58;
      if ((tab_00->Flags & 0x200000U) == 0) {
        local_70 = ImGuiTabBar::GetTabName(local_8,tab_00);
        ImVec2::ImVec2(&local_78,0.0,0.0);
        bVar4 = Selectable(stack0x00000068,backup_cursor_pos.x._3_1_,in_stack_00000060,
                           stack0x00000058);
        pIVar3 = tab_00;
        if (!bVar4) {
          pIVar3 = local_58;
        }
      }
      local_58 = pIVar3;
    }
    EndCombo();
  }
  (local_18->DC).CursorPos = local_24;
  return local_58;
}

Assistant:

static ImGuiTabItem* ImGui::TabBarTabListPopupButton(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We use g.Style.FramePadding.y to match the square ArrowButton size
    const float tab_list_popup_button_width = g.FontSize + g.Style.FramePadding.y;
    const ImVec2 backup_cursor_pos = window->DC.CursorPos;
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x - g.Style.FramePadding.y, tab_bar->BarRect.Min.y);
    tab_bar->BarRect.Min.x += tab_list_popup_button_width;

    ImVec4 arrow_col = g.Style.Colors[ImGuiCol_Text];
    arrow_col.w *= 0.5f;
    PushStyleColor(ImGuiCol_Text, arrow_col);
    PushStyleColor(ImGuiCol_Button, ImVec4(0, 0, 0, 0));
    bool open = BeginCombo("##v", NULL, ImGuiComboFlags_NoPreview | ImGuiComboFlags_HeightLargest);
    PopStyleColor(2);

    ImGuiTabItem* tab_to_select = NULL;
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            if (tab->Flags & ImGuiTabItemFlags_Button)
                continue;

            const char* tab_name = tab_bar->GetTabName(tab);
            if (Selectable(tab_name, tab_bar->SelectedTabId == tab->ID))
                tab_to_select = tab;
        }
        EndCombo();
    }

    window->DC.CursorPos = backup_cursor_pos;
    return tab_to_select;
}